

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool SearchAndAddSourceFile(char **buf,char *name)

{
  bool bVar1;
  char local_128 [8];
  char tmp [256];
  uint tmpSize;
  char *name_local;
  char **buf_local;
  
  tmp[0xfc] = '\0';
  tmp[0xfd] = '\x01';
  tmp[0xfe] = '\0';
  tmp[0xff] = '\0';
  format(local_128,0x100,"%s",name);
  bVar1 = AddSourceFile(buf,local_128);
  if (bVar1) {
    buf_local._7_1_ = true;
  }
  else {
    format(local_128,0x100,"translation/%s",name);
    bVar1 = AddSourceFile(buf,local_128);
    if (bVar1) {
      buf_local._7_1_ = true;
    }
    else {
      format(local_128,0x100,"NULLC/translation/%s",name);
      bVar1 = AddSourceFile(buf,local_128);
      if (bVar1) {
        buf_local._7_1_ = true;
      }
      else {
        format(local_128,0x100,"../NULLC/translation/%s",name);
        bVar1 = AddSourceFile(buf,local_128);
        if (bVar1) {
          buf_local._7_1_ = true;
        }
        else {
          buf_local._7_1_ = false;
        }
      }
    }
  }
  return buf_local._7_1_;
}

Assistant:

bool SearchAndAddSourceFile(char*& buf, const char* name)
{
	const unsigned tmpSize = 256;
	char tmp[tmpSize];
	format(tmp, tmpSize, "%s", name);

	if(AddSourceFile(buf, tmp))
		return true;

	format(tmp, tmpSize, "translation/%s", name);

	if(AddSourceFile(buf, tmp))
		return true;

	format(tmp, tmpSize, "NULLC/translation/%s", name);

	if(AddSourceFile(buf, tmp))
		return true;

	format(tmp, tmpSize, "../NULLC/translation/%s", name);

	if(AddSourceFile(buf, tmp))
		return true;

	return false;
}